

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_test.c
# Opt level: O1

RK_S32 vpu_encode_demo(VpuApiDemoCmdContext_t *cmd)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  RK_U32 *pRVar3;
  RK_S32 RVar4;
  uint uVar5;
  uint uVar6;
  FILE *__stream;
  FILE *__s;
  VpuCodecContext_t *pVVar7;
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  EncoderOut_t *pEVar13;
  uint uVar14;
  EncInputStream_t *pEVar15;
  int Format;
  EncoderOut_t enc_out_yuv;
  long local_b0;
  int local_a8;
  undefined4 local_8c;
  EncInputStream_t local_88;
  undefined8 local_68;
  EncoderOut_t local_58;
  size_t local_38;
  
  local_8c = 0;
  if (cmd == (VpuApiDemoCmdContext_t *)0x0) {
    return -1;
  }
  if ((((cmd->have_input == '\0') || (cmd->width == 0)) || (cmd->height == 0)) ||
     (cmd->coding < OMX_RK_VIDEO_CodingMPEG2)) {
    puts("Warning: missing needed parameters for vpu api demo");
  }
  if (cmd->have_input == '\0') {
    pcVar12 = "please set input bitstream file";
LAB_00101f28:
    puts(pcVar12);
    __stream = (FILE *)0x0;
  }
  else {
    pcVar12 = "encode";
    if (cmd->codec_type == CODEC_DECODER) {
      pcVar12 = "decode";
    }
    printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",(ulong)cmd->width,
           (ulong)cmd->height,(ulong)cmd->coding,pcVar12,cmd->input_file);
    __stream = fopen(cmd->input_file,"rb");
    if (__stream == (FILE *)0x0) {
      pcVar12 = "input file not exsist";
      goto LAB_00101f28;
    }
    if (cmd->have_output == '\0') {
      __s = (FILE *)0x0;
LAB_00102001:
      pVVar7 = (VpuCodecContext_t *)malloc(0xe0);
      ctx = pVVar7;
      if (pVVar7 == (VpuCodecContext_t *)0x0) {
        printf("Input context has not been properly allocated");
        return -1;
      }
      memset(pVVar7,0,0xe0);
      pVVar7->codecType = CODEC_ENCODER;
      pVVar7->videoCoding = OMX_RK_VIDEO_CodingAVC;
      pVVar7->width = cmd->width;
      pVVar7->height = cmd->height;
      fseek(__stream,0,2);
      lVar8 = ftell(__stream);
      fseek(__stream,0,0);
      pEVar15 = &local_88;
      local_88.buf = (RK_U8 *)0x0;
      local_88.size = 0;
      local_88.bufPhyAddr = 0;
      local_88.timeUs = 0;
      local_88.nFlags = 0;
      local_88._28_4_ = 0;
      local_68 = 0;
      pEVar13 = &local_58;
      local_58.data = (RK_U8 *)0x0;
      local_58._8_8_ = 0;
      local_58.timeUs = 0;
      local_58.keyFrame = 0;
      local_58._28_4_ = 0;
      local_58.data = (RK_U8 *)malloc((ulong)(cmd->height * cmd->width));
      uVar11 = 0xffffff98;
      if (local_58.data != (RK_U8 *)0x0) {
        RVar4 = (*vpuapi_open_ctx)(&ctx);
        pVVar7 = ctx;
        uVar5 = uVar11;
        if (ctx != (VpuCodecContext_t *)0x0 && RVar4 == 0) {
          ctx->codecType = cmd->codec_type;
          pVVar7->videoCoding = cmd->coding;
          RVar1 = cmd->width;
          pVVar7->width = RVar1;
          RVar2 = cmd->height;
          pVVar7->height = RVar2;
          pVVar7->no_thread = 1;
          puVar9 = (undefined8 *)malloc(0x40);
          pVVar7->private_data = puVar9;
          *puVar9 = 0;
          puVar9[1] = 0;
          puVar9[2] = 0;
          puVar9[3] = 0;
          puVar9[4] = 0;
          puVar9[5] = 0;
          puVar9[6] = 0;
          puVar9[7] = 0;
          pRVar3 = (RK_U32 *)pVVar7->private_data;
          *pRVar3 = RVar1;
          pRVar3[1] = RVar2;
          pRVar3[8] = 0;
          pRVar3[9] = 0x1e;
          pRVar3[2] = 0;
          pRVar3[3] = 4000000;
          pRVar3[4] = 0x19;
          pRVar3[6] = 1;
          pRVar3[7] = 0;
          pRVar3[0xb] = 100;
          pRVar3[0xc] = 0x28;
          uVar5 = (*pVVar7->init)(pVVar7,(RK_U8 *)0x0,0);
          if (uVar5 == 0) {
            printf("encode init ok, sps len: %d\n",(ulong)(uint)ctx->extradata_size);
            if ((__s != (FILE *)0x0) && (0 < ctx->extradata_size)) {
              printf("dump %d bytes enc output stream to file\n");
              fwrite(ctx->extradata,1,(long)ctx->extradata_size,__s);
              fflush(__s);
            }
            uVar5 = (*ctx->control)(ctx,VPU_API_ENC_SETFORMAT,&local_8c);
            if (uVar5 != 0) {
              printf("VPU_API_ENC_SETFORMAT ret %d\n",(ulong)uVar5);
            }
            uVar5 = (*ctx->control)(ctx,VPU_API_ENC_GETCFG,pRVar3);
            if (uVar5 != 0) {
              printf("VPU_API_ENC_GETCFG ret %d\n",(ulong)uVar5);
            }
            pRVar3[2] = 1;
            uVar6 = (*ctx->control)(ctx,VPU_API_ENC_SETCFG,pRVar3);
            if (uVar6 != 0) {
              printf("VPU_API_ENC_SETCFG ret %d\n",(ulong)uVar6);
            }
            printf("init vpu api context ok, input yuv stream file size: %d\n",lVar8);
            RVar1 = ctx->width;
            RVar2 = ctx->height;
            uVar14 = (RVar1 + 0xf & 0xfffffff0) * (RVar2 + 0xf & 0xfffffff0) * 3 >> 1;
            printf("%d %d %d %d %d");
            lVar10 = ftell(__stream);
            local_a8 = (int)lVar8;
            if (lVar10 < local_a8) {
              local_38 = (size_t)uVar14;
              local_b0 = 0;
              do {
                if (local_88.size == 0) {
                  if (local_88.buf == (RK_U8 *)0x0) {
                    local_88.buf = (RK_U8 *)malloc(local_38);
                    uVar5 = uVar11;
                    if (local_88.buf == (RK_U8 *)0x0) goto LAB_001024e9;
                    local_68 = CONCAT44(local_68._4_4_,uVar14);
                  }
                  if ((uint)local_68 < uVar14) {
                    local_88.buf = (RK_U8 *)realloc(local_88.buf,local_38);
                    uVar5 = uVar11;
                    if (local_88.buf == (RK_U8 *)0x0) goto LAB_001024e9;
                    local_68 = CONCAT44(local_68._4_4_,uVar14);
                  }
                  RVar4 = readBytesFromFile(local_88.buf,RVar1 * RVar2 * 3 >> 1,(FILE *)__stream);
                  uVar5 = uVar6;
                  if (RVar4 != 0) goto LAB_001024e9;
                  local_88.size = uVar14;
                  local_88.timeUs = local_b0;
                  lVar8 = ftell(__stream);
                  printf("read one frame, size: %d, timeUs: %lld, filePos: %ld\n",uVar14,local_b0,
                         lVar8);
                  local_b0 = local_b0 + 40000;
                }
                uVar6 = (*ctx->encode)(ctx,&local_88,&local_58);
                if ((int)uVar6 < 0) {
                  uVar5 = 0xffffff42;
                  goto LAB_001024e9;
                }
                local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
                printf("vpu encode one frame, out len: %d, left size: %d\n",
                       local_58._8_8_ & 0xffffffff,0);
                if ((local_58.size != 0) && (local_58.data != (RK_U8 *)0x0)) {
                  if (__s != (FILE *)0x0) {
                    printf("dump %d bytes enc output stream to file\n");
                    fwrite(local_58.data,1,(long)local_58.size,__s);
                    fflush(__s);
                  }
                  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
                }
                usleep(3000);
                lVar8 = ftell(__stream);
              } while (lVar8 < local_a8);
            }
            puts("read end of file, complete");
            uVar5 = uVar6;
          }
          else {
            printf("init vpu api context fail, ret: 0x%X\n",(ulong)uVar5);
            uVar5 = 0xffffff97;
          }
        }
LAB_001024e9:
        uVar11 = uVar5;
        pEVar15 = &local_88;
        pEVar13 = &local_58;
      }
      goto LAB_00101f3d;
    }
    printf("vpu api demo output file: %s\n",cmd->output_file);
    __s = fopen(cmd->output_file,"wb");
    if (__s != (FILE *)0x0) goto LAB_00102001;
    puts("can not write output file");
  }
  __s = (FILE *)0x0;
  uVar11 = 0xffffff9b;
  pEVar13 = (EncoderOut_t *)0x0;
  pEVar15 = (EncInputStream_t *)0x0;
LAB_00101f3d:
  if ((pEVar15 != (EncInputStream_t *)0x0) && (pEVar15->buf != (RK_U8 *)0x0)) {
    free(pEVar15->buf);
    pEVar15->buf = (RK_U8 *)0x0;
  }
  if ((pEVar13 != (EncoderOut_t *)0x0) && (pEVar13->data != (RK_U8 *)0x0)) {
    free(pEVar13->data);
    pEVar13->data = (RK_U8 *)0x0;
  }
  if (ctx != (VpuCodecContext_t *)0x0) {
    if (ctx->private_data != (void *)0x0) {
      free(ctx->private_data);
      ctx->private_data = (void *)0x0;
    }
    (*vpuapi_close_ctx)(&ctx);
    ctx = (VpuCodecContext_t *)0x0;
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
  if (uVar11 == 0) {
    puts("encode demo complete OK.");
  }
  else {
    printf("encode demo fail, err: %d\n",(ulong)uVar11);
  }
  return uVar11;
}

Assistant:

static RK_S32 vpu_encode_demo(VpuApiDemoCmdContext_t *cmd)
{
    FILE *pInFile = NULL;
    FILE *pOutFile = NULL;
    RK_S32 nal = 0x00000001;
    RK_S32 fileSize;
    RK_S32 ret = 0;
    RK_S32 size;
    RK_U32 readOneFrameSize = 0;
    EncoderOut_t    enc_out_yuv;
    EncoderOut_t *enc_out = NULL;
    VpuApiEncInput enc_in_strm;
    VpuApiEncInput *api_enc_in = &enc_in_strm;
    EncInputStream_t *enc_in = NULL;
    EncParameter_t *enc_param = NULL;
    RK_S64 fakeTimeUs = 0;
    RK_U32 w_align = 0;
    RK_U32 h_align = 0;

    int Format = ENC_INPUT_YUV420_PLANAR;

    if (cmd == NULL) {
        return -1;
    }

    if ((cmd->have_input == 0) || (cmd->width <= 0) || (cmd->height <= 0)
        || (cmd->coding <= OMX_RK_VIDEO_CodingAutoDetect)) {
        printf("Warning: missing needed parameters for vpu api demo\n");
    }

    if (cmd->have_input) {
        printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",
               cmd->width, cmd->height, cmd->coding,
               cmd->codec_type == CODEC_DECODER ? "decode" : "encode",
               cmd->input_file);

        pInFile = fopen(cmd->input_file, "rb");
        if (pInFile == NULL) {
            printf("input file not exsist\n");
            ENCODE_ERR_RET(ERROR_INVALID_PARAM);
        }
    } else {
        printf("please set input bitstream file\n");
        ENCODE_ERR_RET(ERROR_INVALID_PARAM);
    }

    if (cmd->have_output) {
        printf("vpu api demo output file: %s\n",
               cmd->output_file);
        pOutFile = fopen(cmd->output_file, "wb");
        if (pOutFile == NULL) {
            printf("can not write output file\n");
            ENCODE_ERR_RET(ERROR_INVALID_PARAM);
        }
    }

#ifdef FOR_TEST_ENCODE
    ctx = (struct VpuCodecContext *)malloc(sizeof(struct VpuCodecContext));
    if (!ctx) {
        printf("Input context has not been properly allocated");
        return -1;
    }
    memset(ctx, 0, sizeof(struct VpuCodecContext));

    ctx->videoCoding = OMX_RK_VIDEO_CodingAVC;
    ctx->codecType = CODEC_ENCODER;
    ctx->width  = cmd->width;
    ctx->height = cmd->height;
#endif

    fseek(pInFile, 0L, SEEK_END);
    fileSize = ftell(pInFile);
    fseek(pInFile, 0L, SEEK_SET);

    memset(&enc_in_strm, 0, sizeof(VpuApiEncInput));
    enc_in = &enc_in_strm.stream;
    enc_in->buf = NULL;

    memset(&enc_out_yuv, 0, sizeof(EncoderOut_t));
    enc_out = &enc_out_yuv;
    enc_out->data = (RK_U8 *)malloc(cmd->width * cmd->height);
    if (enc_out->data == NULL) {
        ENCODE_ERR_RET(ERROR_MEMORY);
    }

    ret = vpuapi_open_ctx(&ctx);
    if (ret || (ctx == NULL)) {
        ENCODE_ERR_RET(ERROR_MEMORY);
    }

    /*
     ** now init vpu api context. codecType, codingType, width ,height
     ** are all needed before init.
    */
    ctx->codecType = cmd->codec_type;
    ctx->videoCoding = cmd->coding;
    ctx->width = cmd->width;
    ctx->height = cmd->height;
    ctx->no_thread = 1;

    ctx->private_data = malloc(sizeof(EncParameter_t));
    memset(ctx->private_data, 0, sizeof(EncParameter_t));

    enc_param = (EncParameter_t *)ctx->private_data;
    enc_param->width        = cmd->width;
    enc_param->height       = cmd->height;
    enc_param->format       = ENC_INPUT_YUV420_PLANAR;
    enc_param->rc_mode      = 0;
    enc_param->bitRate      = 4000000;
    enc_param->framerate    = 25;
    enc_param->enableCabac  = 1;
    enc_param->cabacInitIdc = 0;
    enc_param->intraPicRate = 30;
    enc_param->profileIdc   = 100;
    enc_param->levelIdc     = 40;

    if ((ret = ctx->init(ctx, NULL, 0)) != 0) {
        printf("init vpu api context fail, ret: 0x%X\n", ret);
        ENCODE_ERR_RET(ERROR_INIT_VPU);
    }

    /*
     ** init of VpuCodecContext while running encode, it returns
     ** sps and pps of encoder output, you need to save sps and pps
     ** after init.
    */
    printf("encode init ok, sps len: %d\n", ctx->extradata_size);
    if (pOutFile && (ctx->extradata_size > 0)) {
        printf("dump %d bytes enc output stream to file\n",
               ctx->extradata_size);

        /* save sps and pps */
        fwrite(ctx->extradata, 1, ctx->extradata_size, pOutFile);
        fflush(pOutFile);
    }

    ret = ctx->control(ctx, VPU_API_ENC_SETFORMAT, &Format);
    if (ret)
        printf("VPU_API_ENC_SETFORMAT ret %d\n", ret);

    ret = ctx->control(ctx, VPU_API_ENC_GETCFG, enc_param);
    if (ret)
        printf("VPU_API_ENC_GETCFG ret %d\n", ret);

    enc_param->rc_mode = 1;

    ret = ctx->control(ctx, VPU_API_ENC_SETCFG, enc_param);
    if (ret)
        printf("VPU_API_ENC_SETCFG ret %d\n", ret);

    /*
     ** vpu api encode process.
    */
    printf("init vpu api context ok, input yuv stream file size: %d\n", fileSize);
    w_align = ((ctx->width + 15) & (~15));
    h_align = ((ctx->height + 15) & (~15));
    size = w_align * h_align * 3 / 2;
    readOneFrameSize = ctx->width * ctx->height * 3 / 2;
    printf("%d %d %d %d %d", ctx->width, ctx->height, w_align, h_align, size);
    nal = BSWAP32(nal);

    do {
        if (ftell(pInFile) >= fileSize) {
            printf("read end of file, complete\n");
            break;
        }

        if (enc_in && (enc_in->size == 0)) {
            if (enc_in->buf == NULL) {
                enc_in->buf = (RK_U8 *)(malloc)(size);
                if (enc_in->buf == NULL) {
                    ENCODE_ERR_RET(ERROR_MEMORY);
                }
                api_enc_in->capability = size;
            }

            if (api_enc_in->capability < ((RK_U32)size)) {
                enc_in->buf = (RK_U8 *)(realloc)((void *)(enc_in->buf), size);
                if (enc_in->buf == NULL) {
                    ENCODE_ERR_RET(ERROR_MEMORY);
                }
                api_enc_in->capability = size;
            }

            if (readBytesFromFile(enc_in->buf, readOneFrameSize, pInFile)) {
                break;
            } else {
                enc_in->size = size;
                enc_in->timeUs = fakeTimeUs;
                fakeTimeUs += 40000;
            }

            printf("read one frame, size: %d, timeUs: %lld, filePos: %ld\n",
                   enc_in->size, enc_in->timeUs, ftell(pInFile));
        }

        if ((ret = ctx->encode(ctx, enc_in, enc_out)) < 0) {
            ENCODE_ERR_RET(ERROR_VPU_DECODE);
        } else {
            enc_in->size = 0;  // TODO encode completely, and set enc_in->size to 0
            printf("vpu encode one frame, out len: %d, left size: %d\n",
                   enc_out->size, enc_in->size);

            /*
             ** encoder output stream is raw bitstream, you need to add nal
             ** head by yourself.
            */
            if ((enc_out->size) && (enc_out->data)) {
                if (pOutFile) {
                    printf("dump %d bytes enc output stream to file\n",
                           enc_out->size);
                    //fwrite((RK_U8*)&nal, 1, 4, pOutFile);  // because output stream have start code, so here mask this code
                    fwrite(enc_out->data, 1, enc_out->size, pOutFile);
                    fflush(pOutFile);
                }

                enc_out->size = 0;
            }
        }

        usleep(3000);
    } while (1);

ENCODE_OUT:
    if (enc_in && enc_in->buf) {
        free(enc_in->buf);
        enc_in->buf = NULL;
    }
    if (enc_out && (enc_out->data)) {
        free(enc_out->data);
        enc_out->data = NULL;
    }
    if (ctx) {
        if (ctx->private_data) {
            free(ctx->private_data);
            ctx->private_data = NULL;
        }
        vpuapi_close_ctx(&ctx);
        ctx = NULL;
    }
    if (pInFile) {
        fclose(pInFile);
        pInFile = NULL;
    }
    if (pOutFile) {
        fclose(pOutFile);
        pOutFile = NULL;
    }

    if (ret) {
        printf("encode demo fail, err: %d\n", ret);
    } else {
        printf("encode demo complete OK.\n");
    }
    return ret;

}